

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O2

void __thiscall
cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::
process<std::vector<NDevice,std::allocator<NDevice>>&,std::vector<NTrodeObj,std::allocator<NTrodeObj>>&>
          (InputArchive<cereal::PortableBinaryInputArchive,1u> *this,
          vector<NDevice,_std::allocator<NDevice>_> *head,
          vector<NTrodeObj,_std::allocator<NTrodeObj>_> *tail)

{
  process<std::vector<NDevice,std::allocator<NDevice>>&>(this,head);
  process<std::vector<NTrodeObj,std::allocator<NTrodeObj>>&>(this,tail);
  return;
}

Assistant:

inline
      void process( T && head, Other && ... tail )
      {
        process( std::forward<T>( head ) );
        process( std::forward<Other>( tail )... );
      }